

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturedmesh.cc
# Opt level: O0

void __thiscall gvr::TexturedMesh::~TexturedMesh(TexturedMesh *this)

{
  undefined8 *in_RDI;
  Mesh *unaff_retaddr;
  
  *in_RDI = &PTR__TexturedMesh_001f92c0;
  if ((void *)in_RDI[0x20] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0x20]);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 0x1c));
  std::__cxx11::string::~string((string *)(in_RDI + 0x18));
  Mesh::~Mesh(unaff_retaddr);
  return;
}

Assistant:

TexturedMesh::~TexturedMesh()
{
  delete [] uv;
}